

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

opj_image_t * pnmtoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  char *pcVar9;
  opj_image_t *poVar10;
  size_t sVar11;
  opj_cparameters_t *extraout_RAX;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  OPJ_INT32 OVar16;
  byte *pbVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint *out_n;
  opj_cparameters_t *poVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  pnm_header header_info;
  opj_image_cmptparm_t cmptparm [4];
  char type [256];
  uchar c1;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint uStack_368;
  char cStack_364;
  char cStack_363;
  char cStack_362;
  char cStack_361;
  char cStack_360;
  char cStack_35f;
  undefined2 uStack_35e;
  opj_cparameters_t *local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  undefined4 local_338;
  short sStack_334;
  undefined1 uStack_332;
  undefined1 uStack_331;
  char local_330 [4];
  uint auStack_32c [61];
  byte local_238;
  char cStack_237;
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  char cStack_230;
  char cStack_22f;
  char cStack_22e;
  char cStack_22d;
  char cStack_22c;
  char cStack_22b;
  char cStack_22a;
  char cStack_229;
  char local_138;
  char local_137 [263];
  
  local_358 = parameters;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pnmtoimage:Failed to open %s for reading!\n",filename);
    return (opj_image_t *)0x0;
  }
  uStack_368 = 0;
  cStack_364 = '\0';
  cStack_363 = '\0';
  cStack_362 = '\0';
  cStack_361 = '\0';
  cStack_360 = '\0';
  cStack_35f = '\0';
  uStack_35e = 0;
  local_378 = 0;
  local_374 = 0;
  local_370 = 0;
  local_36c = 0;
  pcVar9 = fgets(&local_138,0xfa,__stream);
  if (pcVar9 == (char *)0x0) {
    pnmtoimage_cold_3();
  }
  else if (local_138 == 'P') {
    uVar6 = atoi(local_137);
    if (uVar6 - 8 < 0xfffffff9) {
      fprintf(_stderr,"read_pnm_header:magic format %d invalid\n",(ulong)uVar6);
    }
    else {
      bVar24 = false;
      bVar4 = false;
      uStack_368 = uVar6;
      do {
        pcVar9 = fgets(&local_138,0xfa,__stream);
        uVar5 = local_378;
        if (pcVar9 == (char *)0x0) goto LAB_0010a4f5;
        iVar7 = 2;
        if (local_138 == '#') goto LAB_0010a488;
        if (uVar6 == 7) {
          pcVar9 = skip_idf(&local_138,(char *)&local_338);
          if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
LAB_0010a482:
            iVar7 = 1;
          }
          else if (CONCAT13(uStack_332,CONCAT21(sStack_334,local_338._3_1_)) == 0x524448 &&
                   local_338 == 0x48444e45) {
            iVar7 = 3;
            bVar24 = true;
          }
          else {
            if (sStack_334 == 0x48 && local_338 == 0x54444957) {
              out_n = &local_378;
            }
            else if (CONCAT13(uStack_332,CONCAT21(sStack_334,local_338._3_1_)) == 0x544847 &&
                     local_338 == 0x47494548) {
              out_n = &local_374;
            }
            else if (sStack_334 == 0x48 && local_338 == 0x54504544) {
              out_n = &local_36c;
            }
            else {
              if (CONCAT13(uStack_332,CONCAT21(sStack_334,local_338._3_1_)) != 0x4c4156 ||
                  local_338 != 0x5658414d) {
                if (local_330[0] != '\0' ||
                    CONCAT17(uStack_331,CONCAT16(uStack_332,CONCAT24(sStack_334,local_338))) !=
                    0x455059544c505554) {
                  pcVar9 = "read_pnm_header:unknown P7 idf %s\n";
                  pbVar17 = (byte *)&local_338;
LAB_0010a47b:
                  fprintf(_stderr,pcVar9,pbVar17);
                  goto LAB_0010a482;
                }
                pcVar9 = skip_idf(pcVar9,(char *)&local_238);
                if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) goto LAB_0010a482;
                if (CONCAT17(cStack_22b,
                             CONCAT16(cStack_22c,
                                      CONCAT15(cStack_22d,
                                               CONCAT14(cStack_22e,
                                                        CONCAT13(cStack_22f,
                                                                 CONCAT12(cStack_230,
                                                                          CONCAT11(cStack_231,
                                                                                   cStack_232)))))))
                    == 0x4554494857444e &&
                    CONCAT17(cStack_231,
                             CONCAT16(cStack_232,
                                      CONCAT15(cStack_233,
                                               CONCAT14(cStack_234,
                                                        CONCAT13(cStack_235,
                                                                 CONCAT12(cStack_236,
                                                                          CONCAT11(cStack_237,
                                                                                   local_238)))))))
                    == 0x444e414b43414c42) {
                  cStack_360 = '\x01';
                }
                else if (CONCAT11(cStack_22f,cStack_230) == 0x45 &&
                         CONCAT17(cStack_231,
                                  CONCAT16(cStack_232,
                                           CONCAT15(cStack_233,
                                                    CONCAT14(cStack_234,
                                                             CONCAT13(cStack_235,
                                                                      CONCAT12(cStack_236,
                                                                               CONCAT11(cStack_237,
                                                                                        local_238)))
                                                            )))) == 0x4c41435359415247) {
                  cStack_362 = '\x01';
                }
                else {
                  auVar25[0] = -(local_238 == 'G');
                  auVar25[1] = -(cStack_237 == 'R');
                  auVar25[2] = -(cStack_236 == 'A');
                  auVar25[3] = -(cStack_235 == 'Y');
                  auVar25[4] = -(cStack_234 == 'S');
                  auVar25[5] = -(cStack_233 == 'C');
                  auVar25[6] = -(cStack_232 == 'A');
                  auVar25[7] = -(cStack_231 == 'L');
                  auVar25[8] = -(cStack_230 == 'E');
                  auVar25[9] = -(cStack_22f == '_');
                  auVar25[10] = -(cStack_22e == 'A');
                  auVar25[0xb] = -(cStack_22d == 'L');
                  auVar25[0xc] = -(cStack_22c == 'P');
                  auVar25[0xd] = -(cStack_22b == 'H');
                  auVar25[0xe] = -(cStack_22a == 'A');
                  auVar25[0xf] = -(cStack_229 == '\0');
                  if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
                    cStack_361 = '\x01';
                  }
                  else if (CONCAT13(cStack_235,CONCAT12(cStack_236,CONCAT11(cStack_237,local_238)))
                           == 0x424752) {
                    cStack_364 = '\x01';
                  }
                  else {
                    if (CONCAT11(cStack_22f,cStack_230) != 0x41 ||
                        CONCAT17(cStack_231,
                                 CONCAT16(cStack_232,
                                          CONCAT15(cStack_233,
                                                   CONCAT14(cStack_234,
                                                            CONCAT13(cStack_235,
                                                                     CONCAT12(cStack_236,
                                                                              CONCAT11(cStack_237,
                                                                                       local_238))))
                                                  ))) != 0x48504c415f424752) {
                      pcVar9 = "read_pnm_header:unknown P7 TUPLTYPE %s\n";
                      pbVar17 = &local_238;
                      goto LAB_0010a47b;
                    }
                    cStack_363 = '\x01';
                  }
                }
                bVar4 = true;
                goto LAB_0010a488;
              }
              out_n = &local_370;
            }
            pcVar9 = skip_int(pcVar9,(int *)out_n);
            if (pcVar9 == (char *)0x0) goto LAB_0010a482;
            iVar7 = 2 - (uint)(*pcVar9 == '\0');
          }
        }
        else {
          iVar7 = 0;
          pcVar9 = &local_138;
          if (local_378 == 0) {
            pcVar9 = skip_int(&local_138,(int *)&local_378);
            if (pcVar9 == (char *)0x0) {
              iVar7 = 1;
            }
            else {
              iVar7 = 1;
              if ((*pcVar9 != '\0') && (0 < (int)local_378)) goto LAB_0010a328;
            }
          }
          else {
LAB_0010a328:
            if (local_374 == 0) {
              pcVar9 = skip_int(pcVar9,(int *)&local_374);
              if (pcVar9 == (char *)0x0) {
                iVar7 = (uVar5 == 0 && pcVar9 == (char *)0x0) + 1;
              }
              else {
                iVar7 = 1;
                if ((*pcVar9 != '\0') && (0 < (int)local_374)) {
                  if ((uVar6 != 1) && (uVar6 != 4)) goto LAB_0010a334;
                  iVar7 = 3;
                }
              }
            }
            else {
LAB_0010a334:
              pcVar9 = skip_int(pcVar9,(int *)&local_370);
              if (pcVar9 == (char *)0x0) {
                iVar7 = ((byte)iVar7 & pcVar9 == (char *)0x0) + 1;
              }
              else {
                iVar7 = (uint)(*pcVar9 != '\0') * 2 + 1;
              }
            }
          }
        }
LAB_0010a488:
      } while (iVar7 == 2);
      if (iVar7 == 3) {
LAB_0010a4f5:
        if (((((int)uVar6 < 5 && (uVar6 & 6) != 2) || (0xffff0000 < local_370 - 0x10000)) &&
            (0 < (int)local_378)) && (0 < (int)local_374)) {
          if (uVar6 == 7) {
            if (bVar24) {
              if (bVar4 && 0xfffffffb < local_36c - 5) {
                cStack_35f = '\x01';
              }
            }
            else {
              pnmtoimage_cold_2();
            }
          }
          else {
            cStack_35f = '\x01';
            if ((uVar6 == 4) || (uVar6 == 1)) {
              local_370 = 0xff;
            }
          }
        }
      }
    }
  }
  else {
    pnmtoimage_cold_1();
  }
  uVar5 = local_370;
  uVar6 = local_374;
  if (cStack_35f != '\0') {
    uVar20 = (ulong)local_374;
    if ((local_374 != 0 && local_378 != 0) && (uStack_368 != 7 || local_36c != 0)) {
      if ((int)(0x7fffffff / (long)(int)local_374) < (int)local_378) {
        poVar10 = (opj_image_t *)0x0;
        fprintf(_stderr,"pnmtoimage:Image %dx%d too big!\n",(ulong)local_378,(ulong)local_374);
        uVar20 = local_350;
LAB_0010ac51:
        local_350 = uVar20;
        fclose(__stream);
        return poVar10;
      }
      if (uStack_368 < 8) {
        uVar12 = 1;
        if ((0x36U >> (uStack_368 & 0x1f) & 1) == 0) {
          if ((0x48U >> (uStack_368 & 0x1f) & 1) == 0) {
            uVar12 = local_36c;
            if (uStack_368 != 7) goto LAB_0010a5fb;
          }
          else {
            uVar12 = 3;
          }
        }
        uVar22 = 1;
        if ((((1 < (int)local_370) && (uVar22 = 2, 3 < (int)local_370)) &&
            (uVar22 = 3, 7 < (int)local_370)) &&
           (((((uVar22 = 4, 0xf < (int)local_370 && (uVar22 = 5, 0x1f < (int)local_370)) &&
              ((uVar22 = 6, 0x3f < (int)local_370 &&
               ((uVar22 = 7, 0x7f < (int)local_370 && (uVar22 = 8, 0xff < (int)local_370)))))) &&
             (uVar22 = 9, 0x1ff < (int)local_370)) &&
            ((((uVar22 = 10, 0x3ff < (int)local_370 && (uVar22 = 0xb, 0x7ff < (int)local_370)) &&
              (uVar22 = 0xc, 0xfff < (int)local_370)) &&
             ((uVar22 = 0xd, 0x1fff < (int)local_370 && (uVar22 = 0xe, 0x3fff < (int)local_370))))))
           )) {
          uVar22 = (0x7fff < (int)local_370) + 0xf;
        }
        uVar18 = 8;
        if (8 < uVar22) {
          uVar18 = uVar22;
        }
        iVar7 = local_358->subsampling_dx;
        iVar15 = local_358->subsampling_dy;
        local_350 = CONCAT44(local_350._4_4_,uVar12);
        local_348 = (ulong)local_378;
        local_340 = (ulong)uStack_368;
        memset(&local_338,0,(long)(int)uVar12 * 0x24);
        if (0 < (int)local_350) {
          lVar14 = 0;
          do {
            *(uint *)((long)auStack_32c + lVar14 + 0xc) = uVar18;
            *(uint *)((long)auStack_32c + lVar14 + 0x10) = uVar18;
            *(undefined4 *)((long)auStack_32c + lVar14 + 0x14) = 0;
            *(int *)((long)&local_338 + lVar14) = iVar7;
            *(int *)((long)&sStack_334 + lVar14) = iVar15;
            *(int *)(local_330 + lVar14) = (int)local_348;
            *(uint *)((long)auStack_32c + lVar14) = uVar6;
            lVar14 = lVar14 + 0x24;
          } while ((local_350 & 0xffffffff) * 0x24 != lVar14);
        }
        poVar10 = (opj_image_t *)
                  opj_image_create(local_350 & 0xffffffff,&local_338,((int)uVar12 < 3) + '\x01');
        if (poVar10 != (opj_image_t *)0x0) {
          OVar1 = local_358->image_offset_x0;
          poVar10->x0 = OVar1;
          OVar2 = local_358->image_offset_y0;
          poVar10->y0 = OVar2;
          iVar3 = (int)local_348;
          poVar10->x1 = OVar1 + iVar7 * (iVar3 + -1) + 1;
          poVar10->y1 = iVar15 * (uVar6 - 1) + OVar2 + 1;
          uVar12 = (uint)local_340;
          if ((uVar12 & 0xfffffffe) == 2) {
            uVar6 = uVar6 * iVar3;
            bVar24 = 0 < (int)uVar6;
            uVar20 = local_350;
            if (0 < (int)uVar6) {
              local_348 = (ulong)uVar6;
              uVar23 = local_350 & 0xffffffff;
              uVar19 = 0;
              do {
                local_358 = (opj_cparameters_t *)CONCAT71(local_358._1_7_,bVar24);
                if (0 < (int)local_350) {
                  lVar14 = 0;
                  do {
                    local_238 = 0;
                    cStack_237 = '\0';
                    cStack_236 = '\0';
                    cStack_235 = '\0';
                    iVar7 = __isoc99_fscanf(__stream,"%u",&local_238);
                    if (iVar7 != 1) {
                      fwrite("Missing data. Quitting.\n",0x18,1,_stderr);
                      opj_image_destroy(poVar10);
                      fclose(__stream);
                      poVar21 = local_358;
joined_r0x0010ac6d:
                      uVar20 = local_350;
                      if (((ulong)poVar21 & 1) != 0) {
                        return (opj_image_t *)0x0;
                      }
                      goto LAB_0010ac51;
                    }
                    *(int *)(*(long *)((long)&poVar10->comps->data + lVar14) + uVar19 * 4) =
                         (CONCAT13(cStack_235,CONCAT12(cStack_236,CONCAT11(cStack_237,local_238))) *
                         0xff) / (int)uVar5;
                    lVar14 = lVar14 + 0x40;
                  } while (uVar23 << 6 != lVar14);
                }
                uVar19 = uVar19 + 1;
                bVar24 = uVar19 < local_348;
                uVar20 = local_350;
              } while (uVar19 != local_348);
            }
          }
          else if ((uVar12 - 5 < 2) ||
                  ((uVar12 == 7 &&
                   (((cStack_362 != '\0' || (cStack_361 != '\0')) ||
                    ((cStack_364 != '\0' || (cStack_363 != '\0')))))))) {
            uVar6 = uVar6 * iVar3;
            bVar24 = 0 < (int)uVar6;
            uVar20 = local_350;
            if (0 < (int)uVar6) {
              local_358 = (opj_cparameters_t *)(ulong)uVar6;
              uVar19 = local_350 & 0xffffffff;
              poVar21 = (opj_cparameters_t *)0x0;
              do {
                if (0 < (int)local_350) {
                  lVar14 = 0;
                  do {
                    sVar11 = fread(&local_238,1,1,__stream);
                    if (sVar11 == 0) {
LAB_0010aaee:
                      fwrite("Missing data. Quitting.\n",0x18,1,_stderr);
                      opj_image_destroy(poVar10);
                      fclose(__stream);
                      uVar20 = local_350;
                      if (bVar24) {
                        return (opj_image_t *)0x0;
                      }
                      goto LAB_0010ac51;
                    }
                    if (uVar22 < 9) {
                      uVar6 = (uint)local_238;
                    }
                    else {
                      sVar11 = fread(&local_138,1,1,__stream);
                      if (sVar11 == 0) goto LAB_0010aaee;
                      uVar6 = (uint)CONCAT11(local_238,local_138);
                    }
                    *(uint *)(*(long *)((long)&poVar10->comps->data + lVar14) + (long)poVar21 * 4) =
                         uVar6;
                    lVar14 = lVar14 + 0x40;
                  } while (uVar19 << 6 != lVar14);
                }
                poVar21 = (opj_cparameters_t *)((long)&poVar21->tile_size_on + 1);
                bVar24 = poVar21 < local_358;
                uVar20 = local_350;
              } while (poVar21 != local_358);
            }
          }
          else if (uVar12 == 1) {
            uVar20 = local_350;
            if (0 < (int)(uVar6 * iVar3)) {
              uVar19 = 0;
              do {
                iVar7 = __isoc99_fscanf(__stream,"%u",&local_238);
                if (iVar7 == 1) {
                  OVar16 = 0;
                  if (CONCAT13(cStack_235,CONCAT12(cStack_236,CONCAT11(cStack_237,local_238))) == 0)
                  {
                    OVar16 = 0xff;
                  }
                  poVar10->comps->data[uVar19] = OVar16;
                }
                else {
                  pnmtoimage_cold_5();
                }
                if (iVar7 != 1) {
                  return (opj_image_t *)0x0;
                }
                uVar19 = uVar19 + 1;
                uVar20 = local_350;
              } while (uVar6 * iVar3 != uVar19);
            }
          }
          else if (uVar12 == 4) {
            bVar24 = 0 < (int)uVar6;
            if (0 < (int)uVar6) {
              iVar7 = 0;
              iVar15 = 0;
              uVar19 = local_348;
              local_350 = uVar20;
              do {
                if (0 < (int)uVar19) {
                  local_340 = CONCAT71(local_340._1_7_,bVar24);
                  local_358 = (opj_cparameters_t *)CONCAT44(local_358._4_4_,iVar15);
                  lVar14 = (long)iVar15;
                  iVar13 = -1;
                  iVar15 = 0;
                  iVar8 = 0;
                  do {
                    if (iVar13 == -1) {
                      iVar8 = getc(__stream);
                      if (iVar8 == -1) {
                        pnmtoimage_cold_4();
                        poVar21 = extraout_RAX;
                        goto joined_r0x0010ac6d;
                      }
                      iVar13 = 7;
                    }
                    OVar16 = 0;
                    if ((byte)((byte)iVar8 & (byte)(1 << ((byte)iVar13 & 0x1f))) == 0) {
                      OVar16 = 0xff;
                    }
                    poVar10->comps->data[lVar14] = OVar16;
                    iVar13 = iVar13 + -1;
                    lVar14 = lVar14 + 1;
                    iVar15 = iVar15 + -1;
                  } while (-iVar3 != iVar15);
                  iVar15 = (int)local_358 - iVar15;
                  uVar19 = local_348;
                }
                iVar7 = iVar7 + 1;
                bVar24 = iVar7 < (int)local_350;
                uVar20 = local_350;
              } while (iVar7 != (int)local_350);
            }
          }
          else {
            uVar20 = local_350;
            if (((uVar12 == 7) && (cStack_360 != '\0')) && (0 < (int)(uVar6 * iVar3))) {
              uVar19 = 0;
              do {
                sVar11 = fread(&local_238,1,1,__stream);
                if (sVar11 == 0) {
                  pnmtoimage_cold_6();
                  return (opj_image_t *)0x0;
                }
                OVar16 = 0;
                if ((local_238 & 1) == 0) {
                  OVar16 = 0xff;
                }
                poVar10->comps->data[uVar19] = OVar16;
                uVar19 = uVar19 + 1;
                uVar20 = local_350;
              } while (uVar6 * iVar3 != uVar19);
            }
          }
          goto LAB_0010ac51;
        }
      }
    }
  }
LAB_0010a5fb:
  fclose(__stream);
  return (opj_image_t *)0x0;
}

Assistant:

opj_image_t* pnmtoimage(const char *filename, opj_cparameters_t *parameters)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *fp = NULL;
    int i, compno, numcomps, w, h, prec, format;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm[4]; /* RGBA: max. 4 components */
    opj_image_t * image = NULL;
    struct pnm_header header_info;

    if ((fp = fopen(filename, "rb")) == NULL) {
        fprintf(stderr, "pnmtoimage:Failed to open %s for reading!\n", filename);
        return NULL;
    }
    memset(&header_info, 0, sizeof(struct pnm_header));

    read_pnm_header(fp, &header_info);

    if (!header_info.ok) {
        fclose(fp);
        return NULL;
    }

    if (header_info.width == 0
            || header_info.height == 0
            || (header_info.format == 7 && header_info.depth == 0)) {
        fclose(fp);
        return NULL;
    }

    /* This limitation could be removed by making sure to use size_t below */
    if (header_info.height != 0 &&
            header_info.width > INT_MAX / header_info.height) {
        fprintf(stderr, "pnmtoimage:Image %dx%d too big!\n",
                header_info.width, header_info.height);
        fclose(fp);
        return NULL;
    }

    format = header_info.format;

    switch (format) {
    case 1: /* ascii bitmap */
    case 4: /* raw bitmap */
        numcomps = 1;
        break;

    case 2: /* ascii greymap */
    case 5: /* raw greymap */
        numcomps = 1;
        break;

    case 3: /* ascii pixmap */
    case 6: /* raw pixmap */
        numcomps = 3;
        break;

    case 7: /* arbitrary map */
        numcomps = header_info.depth;
        break;

    default:
        fclose(fp);
        return NULL;
    }
    if (numcomps < 3) {
        color_space = OPJ_CLRSPC_GRAY;    /* GRAY, GRAYA */
    } else {
        color_space = OPJ_CLRSPC_SRGB;    /* RGB, RGBA */
    }

    prec = has_prec(header_info.maxval);

    if (prec < 8) {
        prec = 8;
    }

    w = header_info.width;
    h = header_info.height;
    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    memset(&cmptparm[0], 0, (size_t)numcomps * sizeof(opj_image_cmptparm_t));

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)prec;
        cmptparm[i].bpp = (OPJ_UINT32)prec;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(fp);
        return NULL;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)(parameters->image_offset_x0 + (w - 1) * subsampling_dx
                             + 1);
    image->y1 = (OPJ_UINT32)(parameters->image_offset_y0 + (h - 1) * subsampling_dy
                             + 1);

    if ((format == 2) || (format == 3)) { /* ascii pixmap */
        unsigned int index;

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                index = 0;
                if (fscanf(fp, "%u", &index) != 1) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }

                image->comps[compno].data[i] = (OPJ_INT32)(index * 255) / header_info.maxval;
            }
        }
    } else if ((format == 5)
               || (format == 6)
               || ((format == 7)
                   && (header_info.gray || header_info.graya
                       || header_info.rgb || header_info.rgba))) { /* binary pixmap */
        unsigned char c0, c1, one;

        one = (prec < 9);

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                if (!fread(&c0, 1, 1, fp)) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }
                if (one) {
                    image->comps[compno].data[i] = c0;
                } else {
                    if (!fread(&c1, 1, 1, fp)) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                    /* netpbm: */
                    image->comps[compno].data[i] = ((c0 << 8) | c1);
                }
            }
        }
    } else if (format == 1) { /* ascii bitmap */
        for (i = 0; i < w * h; i++) {
            unsigned int index;

            if (fscanf(fp, "%u", &index) != 1) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }

            image->comps[0].data[i] = (index ? 0 : 255);
        }
    } else if (format == 4) {
        int x, y, bit;
        int uc;

        i = 0;
        for (y = 0; y < h; ++y) {
            bit = -1;
            uc = 0;

            for (x = 0; x < w; ++x) {
                if (bit == -1) {
                    bit = 7;
                    uc = getc(fp);
                    if (uc == EOF) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                }
                image->comps[0].data[i] = ((((unsigned char)uc >> bit) & 1) ? 0 : 255);
                --bit;
                ++i;
            }
        }
    } else if ((format == 7 && header_info.bw)) { /*MONO*/
        unsigned char uc;

        for (i = 0; i < w * h; ++i) {
            if (!fread(&uc, 1, 1, fp)) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }
            image->comps[0].data[i] = (uc & 1) ? 0 : 255;
        }
    }
    fclose(fp);

    return image;
}